

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::AdvancedCast::Cleanup(AdvancedCast *this)

{
  CallLogWrapper *this_00;
  
  this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glUseProgram(this_00,0);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->m_vbo);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->m_ebo);
  glu::CallLogWrapper::glDeleteTextures(this_00,2,this->m_texture);
  glu::CallLogWrapper::glDeleteProgram(this_00,this->m_program);
  glu::CallLogWrapper::glDeleteVertexArrays(this_00,1,&this->m_vao);
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glUseProgram(0);
		glDeleteBuffers(1, &m_vbo);
		glDeleteBuffers(1, &m_ebo);
		glDeleteTextures(2, m_texture);
		glDeleteProgram(m_program);
		glDeleteVertexArrays(1, &m_vao);
		return NO_ERROR;
	}